

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

PFFFT_Setup * pffft_new_setup(int N,pffft_transform_t transform)

{
  float fVar1;
  v4sf *pafVar2;
  double dVar3;
  int local_3c;
  float A_1;
  int j_1;
  int i_1;
  float A;
  int j;
  int i;
  int m;
  int k;
  PFFFT_Setup *s;
  pffft_transform_t transform_local;
  int N_local;
  
  _m = (PFFFT_Setup *)malloc(0x60);
  if ((transform == PFFFT_REAL) && ((N % 0x20 != 0 || (N < 1)))) {
    __assert_fail("(N%(2*SIMD_SZ*SIMD_SZ))==0 && N>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x4c0,"PFFFT_Setup *pffft_new_setup(int, pffft_transform_t)");
  }
  if ((transform == PFFFT_COMPLEX) && ((N % 0x10 != 0 || (N < 1)))) {
    __assert_fail("(N%(SIMD_SZ*SIMD_SZ))==0 && N>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x4c1,"PFFFT_Setup *pffft_new_setup(int, pffft_transform_t)");
  }
  _m->N = N;
  _m->transform = transform;
  local_3c = N;
  if (transform == PFFFT_REAL) {
    local_3c = N / 2;
  }
  _m->Ncvec = local_3c / 4;
  pafVar2 = (v4sf *)pffft_aligned_malloc((long)(_m->Ncvec << 1) << 4);
  _m->data = pafVar2;
  _m->e = *_m->data;
  _m->twiddle = _m->data[(_m->Ncvec * 6) / 4];
  if (transform == PFFFT_REAL) {
    for (i = 0; i < _m->Ncvec; i = i + 1) {
      for (j = 0; j < 3; j = j + 1) {
        fVar1 = ((float)(j + 1) * -6.2831855 * (float)i) / (float)N;
        dVar3 = cos((double)fVar1);
        _m->e[((i / 4) * 3 + j) * 8 + i % 4] = (float)dVar3;
        dVar3 = sin((double)fVar1);
        _m->e[(((i / 4) * 3 + j) * 2 + 1) * 4 + i % 4] = (float)dVar3;
      }
    }
    rffti1_ps(N / 4,_m->twiddle,_m->ifac);
  }
  else {
    for (i = 0; i < _m->Ncvec; i = i + 1) {
      for (j = 0; j < 3; j = j + 1) {
        fVar1 = ((float)(j + 1) * -6.2831855 * (float)i) / (float)N;
        dVar3 = cos((double)fVar1);
        _m->e[((i / 4) * 3 + j) * 8 + i % 4] = (float)dVar3;
        dVar3 = sin((double)fVar1);
        _m->e[(((i / 4) * 3 + j) * 2 + 1) * 4 + i % 4] = (float)dVar3;
      }
    }
    cffti1_ps(N / 4,_m->twiddle,_m->ifac);
  }
  j = 1;
  for (i = 0; i < _m->ifac[1]; i = i + 1) {
    j = _m->ifac[i + 2] * j;
  }
  if (j != N / 4) {
    pffft_destroy_setup(_m);
    _m = (PFFFT_Setup *)0x0;
  }
  return _m;
}

Assistant:

PFFFT_Setup *pffft_new_setup(int N, pffft_transform_t transform) {
  PFFFT_Setup *s = (PFFFT_Setup*)malloc(sizeof(PFFFT_Setup));
  int k, m;
  /* unfortunately, the fft size must be a multiple of 16 for complex FFTs 
     and 32 for real FFTs -- a lot of stuff would need to be rewritten to
     handle other cases (or maybe just switch to a scalar fft, I don't know..) */
  if (transform == PFFFT_REAL) { assert((N%(2*SIMD_SZ*SIMD_SZ))==0 && N>0); }
  if (transform == PFFFT_COMPLEX) { assert((N%(SIMD_SZ*SIMD_SZ))==0 && N>0); }
  //assert((N % 32) == 0);
  s->N = N;
  s->transform = transform;  
  /* nb of complex simd vectors */
  s->Ncvec = (transform == PFFFT_REAL ? N/2 : N)/SIMD_SZ;
  s->data = (v4sf*)pffft_aligned_malloc(2*s->Ncvec * sizeof(v4sf));
  s->e = (float*)s->data;
  s->twiddle = (float*)(s->data + (2*s->Ncvec*(SIMD_SZ-1))/SIMD_SZ);  

  if (transform == PFFFT_REAL) {
    for (k=0; k < s->Ncvec; ++k) {
      int i = k/SIMD_SZ;
      int j = k%SIMD_SZ;
      for (m=0; m < SIMD_SZ-1; ++m) {
        float A = -2*M_PI*(m+1)*k / N;
        s->e[(2*(i*3 + m) + 0) * SIMD_SZ + j] = cos(A);
        s->e[(2*(i*3 + m) + 1) * SIMD_SZ + j] = sin(A);
      }
    }
    rffti1_ps(N/SIMD_SZ, s->twiddle, s->ifac);
  } else {
    for (k=0; k < s->Ncvec; ++k) {
      int i = k/SIMD_SZ;
      int j = k%SIMD_SZ;
      for (m=0; m < SIMD_SZ-1; ++m) {
        float A = -2*M_PI*(m+1)*k / N;
        s->e[(2*(i*3 + m) + 0)*SIMD_SZ + j] = cos(A);
        s->e[(2*(i*3 + m) + 1)*SIMD_SZ + j] = sin(A);
      }
    }
    cffti1_ps(N/SIMD_SZ, s->twiddle, s->ifac);
  }

  /* check that N is decomposable with allowed prime factors */
  for (k=0, m=1; k < s->ifac[1]; ++k) { m *= s->ifac[2+k]; }
  if (m != N/SIMD_SZ) {
    pffft_destroy_setup(s); s = 0;
  }

  return s;
}